

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

void ggml_backend_tensor_memset(ggml_tensor *tensor,uint8_t value,size_t offset,size_t size)

{
  ggml_backend_buffer_t pgVar1;
  _func_void_ggml_backend_buffer_t_ggml_tensor_ptr_uint8_t_size_t_size_t *UNRECOVERED_JUMPTABLE;
  ggml_tensor *pgVar2;
  size_t sVar3;
  char *pcVar4;
  int line;
  
  pgVar2 = tensor->view_src;
  if (tensor->view_src == (ggml_tensor *)0x0) {
    pgVar2 = tensor;
  }
  if (size != 0) {
    pgVar1 = pgVar2->buffer;
    if (pgVar1 == (ggml_backend_buffer_t)0x0) {
      pcVar4 = "buf != NULL && \"tensor buffer not set\"";
      line = 0x125;
    }
    else if (tensor->data == (void *)0x0) {
      pcVar4 = "tensor->data != NULL && \"tensor not allocated\"";
      line = 0x126;
    }
    else {
      sVar3 = ggml_nbytes(tensor);
      if (sVar3 < size + offset) {
        pcVar4 = "offset + size <= ggml_nbytes(tensor) && \"tensor write out of bounds\"";
        line = 0x127;
      }
      else {
        UNRECOVERED_JUMPTABLE = (pgVar1->iface).memset_tensor;
        if (UNRECOVERED_JUMPTABLE !=
            (_func_void_ggml_backend_buffer_t_ggml_tensor_ptr_uint8_t_size_t_size_t *)0x0) {
          (*UNRECOVERED_JUMPTABLE)(pgVar1,tensor,value,offset,size);
          return;
        }
        pcVar4 = "buf->iface.memset_tensor != NULL && \"memset not implemented by backend buffer\"";
        line = 0x128;
      }
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,line,"GGML_ASSERT(%s) failed",pcVar4);
  }
  return;
}

Assistant:

void ggml_backend_tensor_memset(struct ggml_tensor * tensor, uint8_t value, size_t offset, size_t size) {
    ggml_backend_buffer_t buf = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;

    if (size == 0) {
        return;
    }

    GGML_ASSERT(buf != NULL && "tensor buffer not set");
    GGML_ASSERT(tensor->data != NULL && "tensor not allocated");
    GGML_ASSERT(offset + size <= ggml_nbytes(tensor) && "tensor write out of bounds");
    GGML_ASSERT(buf->iface.memset_tensor != NULL && "memset not implemented by backend buffer");

    buf->iface.memset_tensor(buf, tensor, value, offset, size);
}